

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.cpp
# Opt level: O3

void __thiscall Omega_h::Library::~Library(Library *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  pointer pFVar3;
  Real total_runtime;
  History *pHVar4;
  I32 IVar5;
  Now b;
  
  if (profile::global_singleton_history != (History *)0x0) {
    b = now();
    total_runtime = operator-(b,(Now)(profile::global_singleton_history->start_time).impl.__d.__r);
    IVar5 = Comm::rank((this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (IVar5 == 0) {
      profile::print_top_down_and_bottom_up(profile::global_singleton_history,total_runtime);
    }
    profile::print_top_sorted(profile::global_singleton_history,total_runtime);
    pHVar4 = profile::global_singleton_history;
    if (profile::global_singleton_history != (History *)0x0) {
      p_Var1 = (profile::global_singleton_history->comm).
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      pcVar2 = (pHVar4->names).chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar2 != (pointer)0x0) {
        operator_delete(pcVar2,(long)(pHVar4->names).chars.
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
      }
      pFVar3 = (pHVar4->frames).
               super__Vector_base<Omega_h::profile::Frame,_std::allocator<Omega_h::profile::Frame>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pFVar3 != (pointer)0x0) {
        operator_delete(pFVar3,(long)(pHVar4->frames).
                                     super__Vector_base<Omega_h::profile::Frame,_std::allocator<Omega_h::profile::Frame>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar3);
      }
    }
    operator_delete(pHVar4,0x70);
    profile::global_singleton_history = (History *)0x0;
  }
  p_Var1 = (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  disable_pooling();
  if (max_memory_stacktrace != (void *)0x0) {
    operator_delete__(max_memory_stacktrace);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&(this->timers)._M_t);
  p_Var1 = (this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->argv_);
  return;
}

Assistant:

Library::~Library() {
  if (Omega_h::profile::global_singleton_history) {
    double total_runtime = now() - Omega_h::profile::global_singleton_history->start_time;
    if (world_->rank() == 0) {
      // FIXME - parallelize?
      Omega_h::profile::print_top_down_and_bottom_up(
          *Omega_h::profile::global_singleton_history, total_runtime);
    }
    Omega_h::profile::print_top_sorted(
          *Omega_h::profile::global_singleton_history, total_runtime);
    delete Omega_h::profile::global_singleton_history;
    Omega_h::profile::global_singleton_history = nullptr;
  }
  // need to destroy all Comm objects prior to MPI_Finalize()
  world_ = CommPtr();
  self_ = CommPtr();
  disable_pooling();
#ifdef OMEGA_H_USE_KOKKOS
  if (we_called_kokkos_init) {
    Kokkos::finalize();
    we_called_kokkos_init = false;
  }
#endif
#ifdef OMEGA_H_USE_MPI
  if (we_called_mpi_init) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Finalize());
    we_called_mpi_init = false;
  }
#endif
  delete[] Omega_h::max_memory_stacktrace;
}